

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::FixedArray<char,1ul>,kj::CappedArray<char,26ul>>
                 (char *target,FixedArray<char,_1UL> *first,CappedArray<char,_26UL> *rest)

{
  char *pcVar1;
  CappedArray<char,_26UL> *first_00;
  char *end;
  char *i;
  CappedArray<char,_26UL> *rest_local;
  FixedArray<char,_1UL> *first_local;
  char *target_local;
  
  end = FixedArray<char,_1UL>::begin(first);
  pcVar1 = FixedArray<char,_1UL>::end(first);
  first_local = (FixedArray<char,_1UL> *)target;
  while (end != pcVar1) {
    first_local->content[0] = *end;
    end = end + 1;
    first_local = first_local + 1;
  }
  first_00 = fwd<kj::CappedArray<char,26ul>>(rest);
  pcVar1 = fill<kj::CappedArray<char,26ul>>(first_local->content,first_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}